

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O1

void __thiscall p2t::Edge::Edge(Edge *this,Point *p1,Point *p2)

{
  double *pdVar1;
  pointer *pppEVar2;
  double dVar3;
  Point *pPVar4;
  iterator __position;
  bool bVar5;
  runtime_error *this_00;
  Edge *local_40 [2];
  Edge local_30;
  
  this->p = p1;
  this->q = p2;
  dVar3 = p1->y;
  pdVar1 = &p2->y;
  if (dVar3 < *pdVar1 || dVar3 == *pdVar1) {
    if ((dVar3 != *pdVar1) || (NAN(dVar3) || NAN(*pdVar1))) goto LAB_006a2630;
    dVar3 = p1->x;
    bVar5 = dVar3 == p2->x;
    if (dVar3 < p2->x || bVar5) {
      if ((bVar5) && (!NAN(dVar3) && !NAN(p2->x))) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_40[0] = &local_30;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"repeat points","");
        std::runtime_error::runtime_error(this_00,(string *)local_40);
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_006a2630;
    }
  }
  this->q = p1;
  this->p = p2;
LAB_006a2630:
  pPVar4 = this->q;
  __position._M_current =
       (pPVar4->edge_list).super__Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (pPVar4->edge_list).super__Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_40[0] = this;
    std::vector<p2t::Edge*,std::allocator<p2t::Edge*>>::_M_realloc_insert<p2t::Edge*>
              ((vector<p2t::Edge*,std::allocator<p2t::Edge*>> *)&pPVar4->edge_list,__position,
               local_40);
  }
  else {
    *__position._M_current = this;
    pppEVar2 = &(pPVar4->edge_list).super__Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppEVar2 = *pppEVar2 + 1;
  }
  return;
}

Assistant:

Edge(Point& p1, Point& p2) : p(&p1), q(&p2)
  {
    if (p1.y > p2.y) {
      q = &p1;
      p = &p2;
    } else if (p1.y == p2.y) {
      if (p1.x > p2.x) {
        q = &p1;
        p = &p2;
      } else if (p1.x == p2.x) {
        // Repeat points
        // ASSIMP_CHANGE (aramis_acg)
        throw std::runtime_error(std::string("repeat points"));
        //assert(false);
      }
    }

    q->edge_list.push_back(this);
  }